

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

ByteData *
cfd::core::SignatureUtil::CalculateEcSignature
          (ByteData *__return_storage_ptr__,ByteData256 *signature_hash,Privkey *private_key,
          bool has_grind_r)

{
  CfdException *this;
  allocator local_8d;
  int ret;
  string local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_data;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer,0x40,
             (allocator_type *)&local_88);
  Privkey::GetData((ByteData *)&local_88,private_key);
  ByteData::GetBytes(&privkey_data,(ByteData *)&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  ByteData256::GetBytes(&sighash,signature_hash);
  ret = wally_ec_sig_from_bytes
                  (privkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)privkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)privkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   (long)sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,(uint)has_grind_r * 4 + 1,
                   buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData(__return_storage_ptr__,&buffer);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sighash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&privkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_88._M_dataplus._M_p = "cfdcore_transaction_common.cpp";
  local_88._M_string_length._0_4_ = 0xdf;
  local_88.field_2._M_allocated_capacity = (long)"CfdCalculateEcSignature" + 3;
  logger::warn<int&>((CfdSourceLocation *)&local_88,"wally_ec_sig_from_bytes NG[{}] ",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_88,"ec signature calculation error.",&local_8d);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData SignatureUtil::CalculateEcSignature(
    const ByteData256 &signature_hash, const Privkey &private_key,
    bool has_grind_r) {
  std::vector<uint8_t> buffer(EC_SIGNATURE_LEN);
  std::vector<uint8_t> privkey_data = private_key.GetData().GetBytes();
  std::vector<uint8_t> sighash = signature_hash.GetBytes();
  uint32_t flag = EC_FLAG_ECDSA;
  if (has_grind_r) {
    flag |= EC_FLAG_GRIND_R;
  }
  int ret = wally_ec_sig_from_bytes(
      privkey_data.data(), privkey_data.size(), sighash.data(), sighash.size(),
      flag, buffer.data(), buffer.size());

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_from_bytes NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "ec signature calculation error.");
  }
  return ByteData(buffer);
}